

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

string * __thiscall pbrt::DielectricMaterial::ToString_abi_cxx11_(DielectricMaterial *this)

{
  string *in_RDI;
  FloatTextureHandle *in_stack_00000008;
  FloatTextureHandle *in_stack_00000010;
  FloatTextureHandle *in_stack_00000020;
  char *in_stack_00000028;
  SpectrumTextureHandle *in_stack_00000040;
  bool *in_stack_00000048;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,bool_const&>
            (in_stack_00000028,in_stack_00000020,&this->displacement,in_stack_00000010,
             in_stack_00000008,in_stack_00000040,in_stack_00000048);
  return in_RDI;
}

Assistant:

std::string DielectricMaterial::ToString() const {
    return StringPrintf("[ DielectricMaterial displacement: %s uRoughness: %s "
                        "vRoughness: %s etaF: %s "
                        "etaS: %s remapRoughness: %s ]",
                        displacement, uRoughness, vRoughness, etaF, etaS, remapRoughness);
}